

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O1

void Ivy_NodeCompactCuts(Ivy_Store_t *pCutStore)

{
  Ivy_Cut_t *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *piVar4;
  int iVar5;
  short sVar6;
  short sVar7;
  short *psVar8;
  int iVar9;
  long lVar10;
  
  if (pCutStore->nCuts < 1) {
    iVar9 = 0;
  }
  else {
    psVar8 = &pCutStore->pCuts[0].nSize;
    lVar10 = 0;
    iVar9 = 0;
    do {
      if (*psVar8 != 0) {
        pIVar1 = (Ivy_Cut_t *)(psVar8 + -2);
        pCutStore->pCuts[iVar9].uHash = *(uint *)(psVar8 + 0xe);
        iVar5 = pIVar1->nLatches;
        sVar6 = pIVar1->nSize;
        sVar7 = pIVar1->nSizeMax;
        uVar2 = *(undefined8 *)(psVar8 + 2);
        uVar3 = *(undefined8 *)(psVar8 + 10);
        piVar4 = pCutStore->pCuts[iVar9].pArray;
        *(undefined8 *)(piVar4 + 2) = *(undefined8 *)(psVar8 + 6);
        *(undefined8 *)(piVar4 + 4) = uVar3;
        pIVar1 = pCutStore->pCuts + iVar9;
        pIVar1->nLatches = iVar5;
        pIVar1->nSize = sVar6;
        pIVar1->nSizeMax = sVar7;
        *(undefined8 *)pIVar1->pArray = uVar2;
        iVar9 = iVar9 + 1;
      }
      lVar10 = lVar10 + 1;
      psVar8 = psVar8 + 0x12;
    } while (lVar10 < pCutStore->nCuts);
  }
  pCutStore->nCuts = iVar9;
  return;
}

Assistant:

void Ivy_NodeCompactCuts( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}